

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_M4X3(Context *ctx)

{
  size_t in_RCX;
  char row2 [64];
  char row1 [64];
  char row0 [64];
  char src0 [64];
  char code [256];
  
  make_METAL_srcarg_string_full(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_full(ctx,1,row0,in_RCX);
  make_METAL_srcarg_string_full(ctx,2,row1,in_RCX);
  make_METAL_srcarg_string_full(ctx,3,row2,in_RCX);
  ctx->metal_need_header_geometric = 1;
  make_METAL_destarg_assign
            (ctx,code,0x100,"float3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",src0,row0,src0,row1,src0
             ,row2);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_M4X3(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
    char row0[64]; make_METAL_srcarg_string_full(ctx, 1, row0, sizeof (row0));
    char row1[64]; make_METAL_srcarg_string_full(ctx, 2, row1, sizeof (row1));
    char row2[64]; make_METAL_srcarg_string_full(ctx, 3, row2, sizeof (row2));
    char code[256];
    ctx->metal_need_header_geometric = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                                "float3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",
                                src0, row0, src0, row1, src0, row2);
    output_line(ctx, "%s", code);
}